

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

int Abc_NodeCompareCiCo(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  iVar2 = 0;
  if (((pNtkOld->vPis->nSize == pNtkNew->vPis->nSize) &&
      (iVar2 = 0, pNtkOld->vPos->nSize == pNtkNew->vPos->nSize)) &&
     (pNtkOld->nObjCounts[8] == pNtkNew->nObjCounts[8])) {
    pVVar6 = pNtkOld->vCis;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        pcVar4 = Nm_ManCreateUniqueName
                           (*(Nm_Man_t **)(*pVVar6->pArray[lVar7] + 0x18),
                            (int)*(long *)((long)pVVar6->pArray[lVar7] + 0x10));
        if (pNtkNew->vCis->nSize <= lVar7) goto LAB_00864a45;
        plVar1 = (long *)pNtkNew->vCis->pArray[lVar7];
        pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
        iVar2 = strcmp(pcVar4,pcVar5);
        if (iVar2 != 0) {
          return 0;
        }
        lVar7 = lVar7 + 1;
        pVVar6 = pNtkOld->vCis;
      } while (lVar7 < pVVar6->nSize);
    }
    pVVar6 = pNtkOld->vCos;
    iVar2 = 1;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        pcVar4 = Nm_ManCreateUniqueName
                           (*(Nm_Man_t **)(*pVVar6->pArray[lVar7] + 0x18),
                            (int)*(long *)((long)pVVar6->pArray[lVar7] + 0x10));
        if (pNtkNew->vCos->nSize <= lVar7) {
LAB_00864a45:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        plVar1 = (long *)pNtkNew->vCos->pArray[lVar7];
        pcVar5 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
        iVar3 = strcmp(pcVar4,pcVar5);
        if (iVar3 != 0) {
          return 0;
        }
        lVar7 = lVar7 + 1;
        pVVar6 = pNtkOld->vCos;
      } while (lVar7 < pVVar6->nSize);
    }
  }
  return iVar2;
}

Assistant:

int Abc_NodeCompareCiCo( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew )
{
    int i;
    if ( Abc_NtkPiNum(pNtkOld) != Abc_NtkPiNum(pNtkNew) )
        return 0;
    if ( Abc_NtkPoNum(pNtkOld) != Abc_NtkPoNum(pNtkNew) )
        return 0;
    if ( Abc_NtkLatchNum(pNtkOld) != Abc_NtkLatchNum(pNtkNew) )
        return 0;
    for ( i = 0; i < Abc_NtkCiNum(pNtkOld); i++ )
        if ( strcmp(Abc_ObjName(Abc_NtkCi(pNtkOld, i)), Abc_ObjName(Abc_NtkCi(pNtkNew, i))) )
            return 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtkOld); i++ )
        if ( strcmp(Abc_ObjName(Abc_NtkCo(pNtkOld, i)), Abc_ObjName(Abc_NtkCo(pNtkNew, i))) )
            return 0;
    return 1;
}